

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_recorder.h
# Opt level: O0

HashtablezInfo * __thiscall
absl::lts_20240722::profiling_internal::
SampleRecorder<absl::lts_20240722::container_internal::HashtablezInfo>::
Register<long_const&,unsigned_long&,unsigned_long&,unsigned_long&,unsigned_short&>
          (SampleRecorder<absl::lts_20240722::container_internal::HashtablezInfo> *this,long *args,
          unsigned_long *args_1,unsigned_long *args_2,unsigned_long *args_3,unsigned_short *args_4)

{
  ulong uVar1;
  atomic<unsigned_long> *paVar2;
  MutexLock local_f8;
  MutexLock sample_lock;
  SampleRecorder<absl::lts_20240722::container_internal::HashtablezInfo> *local_e0;
  HashtablezInfo *sample;
  size_t size;
  unsigned_short *args_local_4;
  unsigned_long *args_local_3;
  unsigned_long *args_local_2;
  unsigned_long *args_local_1;
  long *args_local;
  SampleRecorder<absl::lts_20240722::container_internal::HashtablezInfo> *this_local;
  memory_order __b;
  
  paVar2 = &this->size_estimate_;
  LOCK();
  uVar1 = (paVar2->super___atomic_base<unsigned_long>)._M_i;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  std::operator&(memory_order_relaxed,__memory_order_mask);
  if ((this->max_samples_).super___atomic_base<unsigned_long>._M_i < uVar1) {
    LOCK();
    (this->size_estimate_).super___atomic_base<unsigned_long>._M_i =
         (this->size_estimate_).super___atomic_base<unsigned_long>._M_i - 1;
    UNLOCK();
    LOCK();
    (this->dropped_samples_).super___atomic_base<unsigned_long>._M_i =
         (this->dropped_samples_).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
    this_local = (SampleRecorder<absl::lts_20240722::container_internal::HashtablezInfo> *)0x0;
  }
  else {
    local_e0 = (SampleRecorder<absl::lts_20240722::container_internal::HashtablezInfo> *)
               PopDead<long,unsigned_long,unsigned_long,unsigned_long,unsigned_short>
                         (this,*args,*args_1,*args_2,*args_3,*args_4);
    if (local_e0 == (SampleRecorder<absl::lts_20240722::container_internal::HashtablezInfo> *)0x0) {
      local_e0 = (SampleRecorder<absl::lts_20240722::container_internal::HashtablezInfo> *)
                 operator_new(0x2a0);
      container_internal::HashtablezInfo::HashtablezInfo((HashtablezInfo *)local_e0);
      MutexLock::MutexLock(&local_f8,(Mutex *)local_e0);
      absl::lts_20240722::Mutex::ForgetDeadlockInfo();
      container_internal::HashtablezInfo::PrepareForSampling
                ((HashtablezInfo *)local_e0,*args,*args_1,*args_2,*args_3,*args_4);
      MutexLock::~MutexLock(&local_f8);
      PushNew(this,(HashtablezInfo *)local_e0);
    }
    this_local = local_e0;
  }
  return (HashtablezInfo *)this_local;
}

Assistant:

T* SampleRecorder<T>::Register(Targs&&... args) {
  size_t size = size_estimate_.fetch_add(1, std::memory_order_relaxed);
  if (size > max_samples_.load(std::memory_order_relaxed)) {
    size_estimate_.fetch_sub(1, std::memory_order_relaxed);
    dropped_samples_.fetch_add(1, std::memory_order_relaxed);
    return nullptr;
  }

  T* sample = PopDead(args...);
  if (sample == nullptr) {
    // Resurrection failed.  Hire a new warlock.
    sample = new T();
    {
      absl::MutexLock sample_lock(&sample->init_mu);
      // If flag initialization happens to occur (perhaps in another thread)
      // while in this block, it will lock `graveyard_` which is usually always
      // locked before any sample. This will appear as a lock inversion.
      // However, this code is run exactly once per sample, and this sample
      // cannot be accessed until after it is returned from this method.  This
      // means that this lock state can never be recreated, so we can safely
      // inform the deadlock detector to ignore it.
      sample->init_mu.ForgetDeadlockInfo();
      sample->PrepareForSampling(std::forward<Targs>(args)...);
    }
    PushNew(sample);
  }

  return sample;
}